

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O3

void __thiscall CRegister::RegisterSendCountRequest(CRegister *this,NETADDR Addr)

{
  long in_FS_OFFSET;
  CNetChunk local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.m_ClientID = -1;
  local_38.m_Address.type = Addr.type;
  local_38.m_Address.ip[0] = Addr.ip[0];
  local_38.m_Address.ip[1] = Addr.ip[1];
  local_38.m_Address.ip[2] = Addr.ip[2];
  local_38.m_Address.ip[3] = Addr.ip[3];
  local_38.m_Address.ip[4] = Addr.ip[4];
  local_38.m_Address.ip[5] = Addr.ip[5];
  local_38.m_Address.ip[6] = Addr.ip[6];
  local_38.m_Address.ip[7] = Addr.ip[7];
  local_38.m_Address.ip[8] = Addr.ip[8];
  local_38.m_Address.ip[9] = Addr.ip[9];
  local_38.m_Address.ip[10] = Addr.ip[10];
  local_38.m_Address.ip[0xb] = Addr.ip[0xb];
  local_38.m_Address.ip[0xc] = Addr.ip[0xc];
  local_38.m_Address.ip[0xd] = Addr.ip[0xd];
  local_38.m_Address.ip[0xe] = Addr.ip[0xe];
  local_38.m_Address.ip[0xf] = Addr.ip[0xf];
  local_38.m_Address.port = Addr.port;
  local_38.m_Address.reserved = Addr.reserved;
  local_38.m_Flags = 2;
  local_38.m_DataSize = 8;
  local_38.m_pData = SERVERBROWSE_GETCOUNT;
  CNetServer::Send(this->m_pNetServer,&local_38,0xffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRegister::RegisterSendCountRequest(NETADDR Addr)
{
	CNetChunk Packet;
	Packet.m_ClientID = -1;
	Packet.m_Address = Addr;
	Packet.m_Flags = NETSENDFLAG_CONNLESS;
	Packet.m_DataSize = sizeof(SERVERBROWSE_GETCOUNT);
	Packet.m_pData = SERVERBROWSE_GETCOUNT;
	m_pNetServer->Send(&Packet);
}